

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::V3d::transformVectors(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  
  if (0 < n) {
    lVar10 = 0;
    do {
      fVar1 = *(float *)((long)&in->x + lVar10);
      fVar2 = *(float *)((long)&in->y + lVar10);
      fVar3 = *(float *)((long)&in->z + lVar10);
      fVar4 = (float)(m->up).y;
      fVar5 = (float)(m->right).y;
      fVar6 = (float)(m->at).y;
      fVar7 = (float)(m->up).z;
      fVar8 = (float)(m->right).z;
      fVar9 = (float)(m->at).z;
      *(float *)((long)&out->x + lVar10) =
           (float)(m->at).x * fVar3 + (float)(m->right).x * fVar1 + (float)(m->up).x * fVar2;
      *(float *)((long)&out->y + lVar10) = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2;
      *(float *)((long)&out->z + lVar10) = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7;
      lVar10 = lVar10 + 0xc;
    } while ((ulong)(uint)n * 0xc != lVar10);
  }
  return;
}

Assistant:

void
V3d::transformVectors(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z;
		out[i] = tmp;
	}
}